

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

int lws_client_stash_create(lws *wsi,char **cisin)

{
  size_t sVar1;
  client_info_stash *pcVar2;
  size_t mm;
  client_info_stash *pcStack_30;
  int n;
  char *pc;
  size_t size;
  char **cisin_local;
  lws *wsi_local;
  
  pc = (char *)0x49;
  for (mm._4_4_ = 0; mm._4_4_ < 8; mm._4_4_ = mm._4_4_ + 1) {
    if (cisin[mm._4_4_] != (char *)0x0) {
      sVar1 = strlen(cisin[mm._4_4_]);
      pc = pc + sVar1 + 1;
    }
  }
  if (wsi->stash != (client_info_stash *)0x0) {
    lws_realloc(wsi->stash,0,"free");
    wsi->stash = (client_info_stash *)0x0;
  }
  pcVar2 = (client_info_stash *)lws_realloc((void *)0x0,(size_t)pc,"client stash");
  wsi->stash = pcVar2;
  if (wsi->stash == (client_info_stash *)0x0) {
    wsi_local._4_4_ = 1;
  }
  else {
    memset(wsi->stash,0,0x48);
    pcStack_30 = wsi->stash + 1;
    for (mm._4_4_ = 0; mm._4_4_ < 8; mm._4_4_ = mm._4_4_ + 1) {
      if (cisin[mm._4_4_] != (char *)0x0) {
        wsi->stash->cis[mm._4_4_] = (char *)pcStack_30;
        if ((mm._4_4_ == 1) && (*cisin[1] != '/')) {
          *(undefined1 *)pcStack_30->cis = 0x2f;
          pcStack_30 = (client_info_stash *)((long)pcStack_30->cis + 1);
        }
        sVar1 = strlen(cisin[mm._4_4_]);
        memcpy(pcStack_30,cisin[mm._4_4_],sVar1 + 1);
        pcStack_30 = (client_info_stash *)((long)pcStack_30->cis + sVar1 + 1);
      }
    }
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_client_stash_create(struct lws *wsi, const char **cisin)
{
	size_t size;
	char *pc;
	int n;

	size = sizeof(*wsi->stash) + 1;

	/*
	 * Let's overallocate the stash object with space for all the args
	 * in one hit.
	 */
	for (n = 0; n < CIS_COUNT; n++)
		if (cisin[n])
			size += strlen(cisin[n]) + 1;

	if (wsi->stash)
		lws_free_set_NULL(wsi->stash);

	wsi->stash = lws_malloc(size, "client stash");
	if (!wsi->stash)
		return 1;

	/* all the pointers default to NULL, but no need to zero the args */
	memset(wsi->stash, 0, sizeof(*wsi->stash));

	pc = (char *)&wsi->stash[1];

	for (n = 0; n < CIS_COUNT; n++)
		if (cisin[n]) {
			size_t mm;
			wsi->stash->cis[n] = pc;
			if (n == CIS_PATH && cisin[n][0] != '/')
				*pc++ = '/';
			mm = strlen(cisin[n]) + 1;
			memcpy(pc, cisin[n], mm);
			pc += mm;
		}

	return 0;
}